

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O3

void __thiscall
QOpenGLTextureHelper::qt_TextureSubImage3D
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLint level,
          GLint xoffset,GLint yoffset,GLint zoffset,GLsizei width,GLsizei height,GLsizei depth,
          GLenum format,GLenum type,GLvoid *pixels)

{
  QOpenGLFunctions *pQVar1;
  GLenum GVar2;
  GLenum GVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->functions;
  bVar4 = 5 < target - 0x8515;
  GVar3 = 0x8514;
  if (bVar4) {
    GVar3 = bindingTarget;
  }
  GVar2 = 0x8513;
  if (bVar4) {
    GVar2 = target;
  }
  local_40 = CONCAT44(0xaaaaaaaa,GVar2);
  (**(code **)(*(long *)pQVar1 + 200))(GVar3,(long)&local_40 + 4);
  (*(code *)**(undefined8 **)pQVar1)(local_40 & 0xffffffff,texture);
  (*this->TexSubImage3D)(target,level,xoffset,yoffset,zoffset,width,height,depth,format,type,pixels)
  ;
  (*(code *)**(undefined8 **)pQVar1)(local_40 & 0xffffffff,local_40._4_4_);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureSubImage3D(GLuint texture, GLenum target, GLenum bindingTarget, GLint level, GLint xoffset, GLint yoffset, GLint zoffset, GLsizei width, GLsizei height, GLsizei depth, GLenum format, GLenum type, const GLvoid *pixels)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    glTexSubImage3D(target, level, xoffset, yoffset, zoffset, width, height, depth, format, type, pixels);
}